

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_table_iterators.h
# Opt level: O3

void __thiscall
draco::VertexCornersIterator<draco::CornerTable>::Next
          (VertexCornersIterator<draco::CornerTable> *this)

{
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> IVar1;
  CornerTable *pCVar2;
  uint uVar3;
  uint uVar4;
  
  pCVar2 = this->corner_table_;
  uVar4 = (this->corner_).value_;
  if (this->left_traversal_ != true) {
    uVar3 = 0xffffffff;
    if (uVar4 != 0xffffffff) {
      if (uVar4 * -0x55555555 < 0x55555556) {
        uVar4 = uVar4 + 2;
        if (uVar4 == 0xffffffff) goto LAB_001360b8;
      }
      else {
        uVar4 = uVar4 - 1;
      }
      IVar1.value_ = (pCVar2->opposite_corners_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar4].value_;
      if (IVar1.value_ != 0xffffffff) {
        if (IVar1.value_ * -0x55555555 < 0x55555556) {
          uVar3 = IVar1.value_ + 2;
        }
        else {
          uVar3 = IVar1.value_ - 1;
        }
      }
    }
LAB_001360b8:
    (this->corner_).value_ = uVar3;
    return;
  }
  if (uVar4 == 0xffffffff) {
LAB_0013603d:
    (this->corner_).value_ = 0xffffffff;
  }
  else {
    uVar3 = uVar4 - 2;
    if (0x55555555 < (uVar4 + 1) * -0x55555555) {
      uVar3 = uVar4 + 1;
    }
    if ((uVar3 == 0xffffffff) ||
       (IVar1.value_ = (pCVar2->opposite_corners_).vector_.
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar3].value_,
       IVar1.value_ == 0xffffffff)) goto LAB_0013603d;
    uVar4 = IVar1.value_ - 2;
    if (0x55555555 < (IVar1.value_ + 1) * -0x55555555) {
      uVar4 = IVar1.value_ + 1;
    }
    (this->corner_).value_ = uVar4;
    if (uVar4 != 0xffffffff) {
      if (uVar4 != (this->start_corner_).value_) {
        return;
      }
      (this->corner_).value_ = 0xffffffff;
      return;
    }
  }
  uVar4 = (this->start_corner_).value_;
  uVar3 = 0xffffffff;
  if (uVar4 != 0xffffffff) {
    if (uVar4 * -0x55555555 < 0x55555556) {
      uVar4 = uVar4 + 2;
      if (uVar4 == 0xffffffff) goto LAB_001360c1;
    }
    else {
      uVar4 = uVar4 - 1;
    }
    IVar1.value_ = (pCVar2->opposite_corners_).vector_.
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar4].value_;
    if (IVar1.value_ != 0xffffffff) {
      if (IVar1.value_ * -0x55555555 < 0x55555556) {
        uVar3 = IVar1.value_ + 2;
      }
      else {
        uVar3 = IVar1.value_ - 1;
      }
    }
  }
LAB_001360c1:
  (this->corner_).value_ = uVar3;
  this->left_traversal_ = false;
  return;
}

Assistant:

void Next() {
    if (left_traversal_) {
      corner_ = corner_table_->SwingLeft(corner_);
      if (corner_ == kInvalidCornerIndex) {
        // Open boundary reached.
        corner_ = corner_table_->SwingRight(start_corner_);
        left_traversal_ = false;
      } else if (corner_ == start_corner_) {
        // End reached.
        corner_ = kInvalidCornerIndex;
      }
    } else {
      // Go to the right until we reach a boundary there (no explicit check
      // is needed in this case).
      corner_ = corner_table_->SwingRight(corner_);
    }
  }